

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::generateAttributeData
          (DepthDrawCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  int iVar1;
  undefined8 uVar2;
  pointer *ppiVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  pointer *local_140;
  int local_108;
  int local_104;
  int vtxNdx_1;
  int vtxNdx;
  float local_f8 [2];
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  pointer *local_a0;
  Vec4 *cellColor;
  int cellY;
  int cellX;
  int cellNdx;
  int ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int local_78;
  undefined1 local_74 [4];
  int ndx;
  Random rnd;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> cellOrder;
  Vec4 color2;
  Vec4 color1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data_local;
  DepthDrawCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(color2.m_data + 2),0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1.0,1.0,1.0,1.0);
  iVar1 = this->m_gridSize;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)(iVar1 * iVar1),&local_51);
  std::allocator<int>::~allocator(&local_51);
  de::Random::Random((Random *)local_74,0xab54321);
  local_78 = 0;
  while( true ) {
    iVar1 = local_78;
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    iVar4 = local_78;
    if ((int)sVar5 <= iVar1) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_78);
    *pvVar6 = iVar4;
    local_78 = local_78 + 1;
  }
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_50);
  _cellNdx = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_50);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_74,local_80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_cellNdx);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)(this->m_gridSize * this->m_gridSize * 0xc));
  cellX = 0;
  while( true ) {
    iVar1 = cellX;
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    if ((int)sVar5 <= iVar1) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)cellX);
    cellY = *pvVar6;
    cellColor._4_4_ = cellY % this->m_gridSize;
    cellColor._0_4_ = cellY / this->m_gridSize;
    if ((cellColor._4_4_ + (int)cellColor) % 2 == 0) {
      local_140 = (pointer *)(color2.m_data + 2);
    }
    else {
      local_140 = &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    }
    local_a0 = local_140;
    fVar9 = (float)cellColor._4_4_ / (float)this->m_gridSize;
    fVar10 = (float)(int)cellColor / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector(&local_b0,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = local_b0.m_data._0_8_;
    *(undefined8 *)(pvVar7->m_data + 2) = local_b0.m_data._8_8_;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 1));
    uVar2 = ppiVar3[1];
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(undefined8 *)(pvVar7->m_data + 2) = uVar2;
    fVar9 = (float)(cellColor._4_4_ + 1) / (float)this->m_gridSize;
    fVar10 = (float)((int)cellColor + 1) / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector(&local_c0,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 2));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = local_c0.m_data._0_8_;
    *(undefined8 *)(pvVar7->m_data + 2) = local_c0.m_data._8_8_;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 3));
    uVar2 = ppiVar3[1];
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(undefined8 *)(pvVar7->m_data + 2) = uVar2;
    fVar9 = (float)cellColor._4_4_ / (float)this->m_gridSize;
    fVar10 = (float)((int)cellColor + 1) / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector(&local_d0,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 4));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = local_d0.m_data._0_8_;
    *(undefined8 *)(pvVar7->m_data + 2) = local_d0.m_data._8_8_;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 5));
    uVar2 = ppiVar3[1];
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(undefined8 *)(pvVar7->m_data + 2) = uVar2;
    fVar9 = (float)cellColor._4_4_ / (float)this->m_gridSize;
    fVar10 = (float)(int)cellColor / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector(&local_e0,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 6));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = local_e0.m_data._0_8_;
    *(undefined8 *)(pvVar7->m_data + 2) = local_e0.m_data._8_8_;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 7));
    uVar2 = ppiVar3[1];
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(undefined8 *)(pvVar7->m_data + 2) = uVar2;
    fVar9 = (float)(cellColor._4_4_ + 1) / (float)this->m_gridSize;
    fVar10 = (float)(int)cellColor / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector(&local_f0,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 8));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = local_f0.m_data._0_8_;
    *(undefined8 *)(pvVar7->m_data + 2) = local_f0.m_data._8_8_;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 9));
    uVar2 = ppiVar3[1];
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(undefined8 *)(pvVar7->m_data + 2) = uVar2;
    fVar9 = (float)(cellColor._4_4_ + 1) / (float)this->m_gridSize;
    fVar10 = (float)((int)cellColor + 1) / (float)this->m_gridSize;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&vtxNdx_1,fVar9 + fVar9 + -1.0,fVar10 + fVar10 + -1.0,0.0,0.0);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 10));
    ppiVar3 = local_a0;
    *(undefined8 *)pvVar7->m_data = _vtxNdx_1;
    *(float (*) [2])(pvVar7->m_data + 2) = local_f8;
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (data,(long)(cellX * 0xc + 0xb));
    *(pointer *)pvVar7->m_data = *ppiVar3;
    *(pointer *)(pvVar7->m_data + 2) = ppiVar3[1];
    for (local_104 = 0; local_104 < 6; local_104 = local_104 + 1) {
      fVar9 = de::Random::getFloat((Random *)local_74,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(cellX * 0xc + local_104 * 2));
      pfVar8 = tcu::Vector<float,_4>::z(pvVar7);
      *pfVar8 = fVar9;
    }
    for (local_108 = 0; local_108 < 6; local_108 = local_108 + 1) {
      fVar9 = de::Random::getFloat((Random *)local_74,0.0,1.0);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](data,(long)(cellX * 0xc + local_108 * 2));
      pfVar8 = tcu::Vector<float,_4>::w(pvVar7);
      *pfVar8 = fVar9;
    }
    cellX = cellX + 1;
  }
  de::Random::~Random((Random *)local_74);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void DepthDrawCase::generateAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		color1				(0.0f, 0.0f, 0.0f, 0.0f); // mix weights
	const tcu::Vec4		color2				(1.0f, 1.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder			(m_gridSize * m_gridSize);
	de::Random			rnd					(0xAB54321);

	// generate grid with cells in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(m_gridSize * m_gridSize * 6 * 2);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int			cellNdx		= cellOrder[ndx];
		const int			cellX		= cellNdx % m_gridSize;
		const int			cellY		= cellNdx / m_gridSize;
		const tcu::Vec4&	cellColor	= ((cellX+cellY)%2 == 0) ? (color1) : (color2);

		data[ndx * 6 * 2 +  0] = tcu::Vec4(float(cellX+0) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+0) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 +  1] = cellColor;
		data[ndx * 6 * 2 +  2] = tcu::Vec4(float(cellX+1) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+1) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 +  3] = cellColor;
		data[ndx * 6 * 2 +  4] = tcu::Vec4(float(cellX+0) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+1) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 +  5] = cellColor;
		data[ndx * 6 * 2 +  6] = tcu::Vec4(float(cellX+0) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+0) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 +  7] = cellColor;
		data[ndx * 6 * 2 +  8] = tcu::Vec4(float(cellX+1) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+0) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 +  9] = cellColor;
		data[ndx * 6 * 2 + 10] = tcu::Vec4(float(cellX+1) / float(m_gridSize) * 2.0f - 1.0f, float(cellY+1) / float(m_gridSize) * 2.0f - 1.0f, 0.0f, 0.0f);	data[ndx * 6 * 2 + 11] = cellColor;

		// Fill Z with random values (fake Z)
		for (int vtxNdx = 0; vtxNdx < 6; ++vtxNdx)
			data[ndx * 6 * 2 + 2*vtxNdx].z() = rnd.getFloat(0.0f, 1.0);

		// Fill W with other random values (written Z)
		for (int vtxNdx = 0; vtxNdx < 6; ++vtxNdx)
			data[ndx * 6 * 2 + 2*vtxNdx].w() = rnd.getFloat(0.0f, 1.0);
	}
}